

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
CharacterInstance::representation_abi_cxx11_(CharacterInstance *this)

{
  int iVar1;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffff88;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  iVar1 = (int)*(char *)(in_RSI + 0x58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,1,(char)iVar1,&local_51);
  std::operator+((char *)CONCAT44(iVar1,in_stack_ffffffffffffff88),in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffff88),(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return in_RDI;
}

Assistant:

std::string CharacterInstance::representation() const {
    return "'" + std::string(1, _value) + "'";
}